

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_finish(mbedtls_cipher_context_t *ctx,uchar *output,size_t *olen)

{
  mbedtls_operation_t mVar1;
  _func_void_uchar_ptr_size_t_size_t *p_Var2;
  _func_int_void_ptr_mbedtls_operation_t_size_t_uchar_ptr_uchar_ptr_uchar_ptr *p_Var3;
  void *pvVar4;
  _func_int_uchar_ptr_size_t_size_t_ptr *p_Var5;
  int iVar6;
  uint uVar7;
  int ret;
  size_t *olen_local;
  uchar *output_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    *olen = 0;
    if (((((ctx->cipher_info->mode == MBEDTLS_MODE_CFB) ||
          (ctx->cipher_info->mode == MBEDTLS_MODE_OFB)) ||
         (ctx->cipher_info->mode == MBEDTLS_MODE_CTR)) ||
        ((ctx->cipher_info->mode == MBEDTLS_MODE_GCM || (ctx->cipher_info->mode == MBEDTLS_MODE_XTS)
         ))) || (ctx->cipher_info->mode == MBEDTLS_MODE_STREAM)) {
      ctx_local._4_4_ = 0;
    }
    else if ((ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20) ||
            (ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20_POLY1305)) {
      ctx_local._4_4_ = 0;
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_ECB) {
      if (ctx->unprocessed_len == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = -0x6280;
      }
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_CBC) {
      if (ctx->operation == MBEDTLS_ENCRYPT) {
        if (ctx->add_padding == (_func_void_uchar_ptr_size_t_size_t *)0x0) {
          if (ctx->unprocessed_len != 0) {
            return -0x6280;
          }
          return 0;
        }
        p_Var2 = ctx->add_padding;
        iVar6 = mbedtls_cipher_get_iv_size(ctx);
        (*p_Var2)(ctx->unprocessed_data,(long)iVar6,ctx->unprocessed_len);
      }
      else {
        uVar7 = mbedtls_cipher_get_block_size(ctx);
        if ((ulong)uVar7 != ctx->unprocessed_len) {
          if ((ctx->add_padding == (_func_void_uchar_ptr_size_t_size_t *)0x0) &&
             (ctx->unprocessed_len == 0)) {
            return 0;
          }
          return -0x6280;
        }
      }
      p_Var3 = ctx->cipher_info->base->cbc_func;
      pvVar4 = ctx->cipher_ctx;
      mVar1 = ctx->operation;
      uVar7 = mbedtls_cipher_get_block_size(ctx);
      ctx_local._4_4_ = (*p_Var3)(pvVar4,mVar1,(size_t)uVar7,ctx->iv,ctx->unprocessed_data,output);
      if (ctx_local._4_4_ == 0) {
        if (ctx->operation == MBEDTLS_DECRYPT) {
          p_Var5 = ctx->get_padding;
          uVar7 = mbedtls_cipher_get_block_size(ctx);
          ctx_local._4_4_ = (*p_Var5)(output,(size_t)uVar7,olen);
        }
        else {
          uVar7 = mbedtls_cipher_get_block_size(ctx);
          *olen = (ulong)uVar7;
          ctx_local._4_4_ = 0;
        }
      }
    }
    else {
      ctx_local._4_4_ = -0x6080;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_finish( mbedtls_cipher_context_t *ctx,
                   unsigned char *output, size_t *olen )
{
    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( output != NULL );
    CIPHER_VALIDATE_RET( olen != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    *olen = 0;

    if( MBEDTLS_MODE_CFB == ctx->cipher_info->mode ||
        MBEDTLS_MODE_OFB == ctx->cipher_info->mode ||
        MBEDTLS_MODE_CTR == ctx->cipher_info->mode ||
        MBEDTLS_MODE_GCM == ctx->cipher_info->mode ||
        MBEDTLS_MODE_XTS == ctx->cipher_info->mode ||
        MBEDTLS_MODE_STREAM == ctx->cipher_info->mode )
    {
        return( 0 );
    }

    if ( ( MBEDTLS_CIPHER_CHACHA20          == ctx->cipher_info->type ) ||
         ( MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type ) )
    {
        return( 0 );
    }

    if( MBEDTLS_MODE_ECB == ctx->cipher_info->mode )
    {
        if( ctx->unprocessed_len != 0 )
            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

        return( 0 );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( MBEDTLS_MODE_CBC == ctx->cipher_info->mode )
    {
        int ret = 0;

        if( MBEDTLS_ENCRYPT == ctx->operation )
        {
            /* check for 'no padding' mode */
            if( NULL == ctx->add_padding )
            {
                if( 0 != ctx->unprocessed_len )
                    return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

                return( 0 );
            }

            ctx->add_padding( ctx->unprocessed_data, mbedtls_cipher_get_iv_size( ctx ),
                    ctx->unprocessed_len );
        }
        else if( mbedtls_cipher_get_block_size( ctx ) != ctx->unprocessed_len )
        {
            /*
             * For decrypt operations, expect a full block,
             * or an empty block if no padding
             */
            if( NULL == ctx->add_padding && 0 == ctx->unprocessed_len )
                return( 0 );

            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );
        }

        /* cipher block */
        if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                ctx->operation, mbedtls_cipher_get_block_size( ctx ), ctx->iv,
                ctx->unprocessed_data, output ) ) )
        {
            return( ret );
        }

        /* Set output size for decryption */
        if( MBEDTLS_DECRYPT == ctx->operation )
            return( ctx->get_padding( output, mbedtls_cipher_get_block_size( ctx ),
                                      olen ) );

        /* Set output size for encryption */
        *olen = mbedtls_cipher_get_block_size( ctx );
        return( 0 );
    }
#else
    ((void) output);
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
}